

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O0

int matchplus(regex_t p,regex_t *pattern,char *text,int *matchlength)

{
  int iVar1;
  bool bVar2;
  regex_t p_00;
  char *prepoint;
  int *matchlength_local;
  char *text_local;
  regex_t *pattern_local;
  regex_t p_local;
  
  p_00.u = p.u;
  matchlength_local = (int *)text;
  while( true ) {
    bVar2 = false;
    if ((char)*matchlength_local != '\0') {
      p_00._1_7_ = 0;
      p_00.type = p.type;
      iVar1 = matchone(p_00,(char)*matchlength_local);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    matchlength_local = (int *)((long)matchlength_local + 1);
    *matchlength = *matchlength + 1;
  }
  while( true ) {
    if (matchlength_local <= text) {
      return 0;
    }
    iVar1 = matchpattern(pattern,(char *)matchlength_local,matchlength);
    if (iVar1 != 0) break;
    *matchlength = *matchlength + -1;
    matchlength_local = (int *)((long)matchlength_local + -1);
  }
  return 1;
}

Assistant:

static int matchplus(regex_t p, regex_t* pattern, const char* text, int* matchlength)
{
  const char* prepoint = text;
  while ((text[0] != '\0') && matchone(p, *text))
  {
    text++;
    (*matchlength)++;
  }
  while (text > prepoint)
  {
    if (matchpattern(pattern, text--, matchlength))
      return 1;
    (*matchlength)--;
  }

  return 0;
}